

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall
pugi::impl::anon_unknown_0::xml_parser::parse_doctype_ignore(xml_parser *this,char_t *s)

{
  bool bVar1;
  long local_28;
  size_t depth;
  char_t *s_local;
  xml_parser *this_local;
  
  local_28 = 0;
  bVar1 = false;
  if ((*s == '<') && (bVar1 = false, s[1] == '!')) {
    bVar1 = s[2] == '[';
  }
  if (bVar1) {
    depth = (size_t)(s + 3);
    while( true ) {
      while( true ) {
        while( true ) {
          if (*(char *)depth == '\0') {
            this->error_offset = (char_t *)depth;
            this->error_status = status_bad_doctype;
            return (char_t *)0x0;
          }
          if (((*(char *)depth != '<') || (*(char *)(depth + 1) != '!')) ||
             (*(char *)(depth + 2) != '[')) break;
          depth = depth + 3;
          local_28 = local_28 + 1;
        }
        if (((*(char *)depth == ']') && (*(char *)(depth + 1) == ']')) &&
           (*(char *)(depth + 2) == '>')) break;
        depth = depth + 1;
      }
      depth = depth + 3;
      if (local_28 == 0) break;
      local_28 = local_28 + -1;
    }
    return (char_t *)depth;
  }
  __assert_fail("s[0] == \'<\' && s[1] == \'!\' && s[2] == \'[\'",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                ,0xbb6,
                "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_doctype_ignore(char_t *)"
               );
}

Assistant:

char_t* parse_doctype_ignore(char_t* s)
		{
			size_t depth = 0;

			assert(s[0] == '<' && s[1] == '!' && s[2] == '[');
			s += 3;

			while (*s)
			{
				if (s[0] == '<' && s[1] == '!' && s[2] == '[')
				{
					// nested ignore section
					s += 3;
					depth++;
				}
				else if (s[0] == ']' && s[1] == ']' && s[2] == '>')
				{
					// ignore section end
					s += 3;

					if (depth == 0)
						return s;

					depth--;
				}
				else s++;
			}

			PUGI_IMPL_THROW_ERROR(status_bad_doctype, s);
		}